

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::on_text(format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *this,char *begin,char *end)

{
  buffer_appender<char> it;
  type n;
  buffer_appender<char> __result;
  
  n = to_unsigned<long>((long)end - (long)begin);
  it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       (this->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  __result = reserve<char>(it,n);
  std::copy_n<char_const*,unsigned_long,fmt::v7::detail::buffer_appender<char>>(begin,n,__result);
  (this->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  return;
}

Assistant:

void on_text(const Char* begin, const Char* end) {
    auto size = to_unsigned(end - begin);
    auto out = context.out();
    auto&& it = reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }